

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

AggregateFunction *
duckdb::GetApproximateQuantileAggregateFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  bool bVar2;
  InternalException *this;
  LogicalType *in_RCX;
  LogicalType *return_type;
  uint *return_type_00;
  AggregateFunction *this_00;
  LogicalType *this_01;
  allocator local_1c9;
  string local_1c8;
  LogicalType local_1a8;
  undefined1 local_190 [48];
  undefined1 local_160 [72];
  LogicalType local_118;
  undefined1 local_100 [48];
  undefined1 local_d0 [48];
  undefined1 local_a0 [48];
  undefined1 local_70 [48];
  
  LogicalType::LogicalType((LogicalType *)&local_1c8,TIME_TZ);
  bVar2 = LogicalType::operator==(type,(LogicalType *)&local_1c8);
  LogicalType::~LogicalType((LogicalType *)&local_1c8);
  if (bVar2) {
    this_00 = (AggregateFunction *)&stack0xffffffffffffffc0;
    LogicalType::LogicalType((LogicalType *)this_00,type);
    this_01 = (LogicalType *)(local_70 + 0x18);
    LogicalType::LogicalType(this_01,type);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ApproxQuantileState,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,this_00,this_01,in_RCX);
  }
  else {
    PVar1 = type->physical_type_;
    return_type = (LogicalType *)(ulong)PVar1;
    return_type_00 = &switchD_01cb9309::switchdataD_02102758;
    switch(PVar1) {
    case INT8:
      this_00 = (AggregateFunction *)local_70;
      LogicalType::LogicalType((LogicalType *)this_00,type);
      this_01 = (LogicalType *)(local_a0 + 0x18);
      LogicalType::LogicalType(this_01,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,signed_char,signed_char,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type_00);
      break;
    case UINT16:
    case UINT32:
    case UINT64:
    case UINT64|UINT8:
switchD_01cb9309_caseD_4:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"Unimplemented quantile aggregate",&local_1c9);
      InternalException::InternalException(this,&local_1c8);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case INT16:
      this_00 = (AggregateFunction *)local_a0;
      LogicalType::LogicalType((LogicalType *)this_00,type);
      this_01 = (LogicalType *)(local_d0 + 0x18);
      LogicalType::LogicalType(this_01,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,short,short,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type_00);
      break;
    case INT32:
      this_00 = (AggregateFunction *)local_d0;
      LogicalType::LogicalType((LogicalType *)this_00,type);
      this_01 = (LogicalType *)(local_100 + 0x18);
      LogicalType::LogicalType(this_01,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,int,int,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type_00);
      break;
    case INT64:
      this_00 = (AggregateFunction *)local_100;
      LogicalType::LogicalType((LogicalType *)this_00,type);
      this_01 = &local_118;
      LogicalType::LogicalType(this_01,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,long,long,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type_00);
      break;
    case FLOAT:
      this_00 = (AggregateFunction *)local_160;
      LogicalType::LogicalType((LogicalType *)this_00,type);
      this_01 = (LogicalType *)(local_190 + 0x18);
      LogicalType::LogicalType(this_01,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,float,float,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type_00);
      break;
    case DOUBLE:
      this_00 = (AggregateFunction *)local_190;
      LogicalType::LogicalType((LogicalType *)this_00,type);
      this_01 = &local_1a8;
      LogicalType::LogicalType(this_01,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,double,double,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type_00);
      break;
    default:
      if (PVar1 != INT128) goto switchD_01cb9309_caseD_4;
      this_00 = (AggregateFunction *)(local_160 + 0x30);
      LogicalType::LogicalType((LogicalType *)this_00,type);
      this_01 = (LogicalType *)(local_160 + 0x18);
      LogicalType::LogicalType(this_01,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,this_00,this_01,return_type);
    }
  }
  LogicalType::~LogicalType(this_01);
  LogicalType::~LogicalType((LogicalType *)this_00);
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetApproximateQuantileAggregateFunction(const LogicalType &type) {
	//	Not binary comparable
	if (type == LogicalType::TIME_TZ) {
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, dtime_tz_t, dtime_tz_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	}
	switch (type.InternalType()) {
	case PhysicalType::INT8:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int8_t, int8_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT16:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int16_t, int16_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT32:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int32_t, int32_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT64:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int64_t, int64_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT128:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, hugeint_t, hugeint_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::FLOAT:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, float, float,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::DOUBLE:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, double, double,
		                                                   ApproxQuantileScalarOperation>(type, type);
	default:
		throw InternalException("Unimplemented quantile aggregate");
	}
}